

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O2

int nn_dns_check_hostname(char *name,size_t namelen)

{
  byte bVar1;
  size_t sVar2;
  int iVar3;
  bool bVar4;
  
  if ((namelen - 0x100 < 0xffffffffffffff01) || (*name == '-')) {
    return -0x16;
  }
  sVar2 = 0;
  iVar3 = 0;
  do {
    if (namelen == sVar2) {
      return 0;
    }
    bVar1 = name[sVar2];
    if (bVar1 == 0x2e) {
      bVar4 = iVar3 == 0;
      iVar3 = 0;
      if (bVar4) {
        return -0x16;
      }
    }
    else {
      if ((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x2d && (byte)(bVar1 - 0x3a) < 0xf6))
      {
        return -0x16;
      }
      if (0x3e < iVar3) {
        return -0x16;
      }
      iVar3 = iVar3 + 1;
    }
    sVar2 = sVar2 + 1;
  } while( true );
}

Assistant:

int nn_dns_check_hostname (const char *name, size_t namelen)
{
    int labelsz;

    /*  There has to be at least one label in the hostname.
        Additionally, hostnames are up to 255 characters long. */
    if (namelen < 1 || namelen > 255)
        return -EINVAL;

    /*  Hyphen can't be used as a first character of the hostname. */
    if (*name == '-')
        return -EINVAL;

    labelsz = 0;
    while (1) {

        /*  End of the hostname. */
        if (namelen == 0) {
            /*  Success! */
            return 0;
        }

        /*  End of a label. */
        if (*name == '.') {

            /*  The old label cannot be empty. */
            if (labelsz == 0)
                return -EINVAL;

            /*  Start new label. */
            labelsz = 0;
            ++name;
            --namelen;
            continue;
        }

        /*  Valid character. */
        if ((*name >= 'a' && *name <= 'z') ||
              (*name >= 'A' && *name <= 'Z') ||
              (*name >= '0' && *name <= '9') ||
              *name == '-') {
            ++name;
            --namelen;
            ++labelsz;

            /*  Labels longer than 63 charcters are not permitted. */
            if (labelsz > 63)
                return -EINVAL;

            continue;
        }

        /*  Invalid character. */
        return -EINVAL;
    }
}